

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint ON_MeshNgon::FindNgonBoundaries
               (ON_3dPointListRef *mesh_vertex_list,ON_MeshFaceList *mesh_face_list,
               ON_MeshVertexFaceMap *vertex_face_map,size_t ngon_fi_count,uint *ngon_fi,
               ON_SimpleArray<unsigned_int> *ngon_vi,ON_SimpleArray<unsigned_int> *ngon_vi_markers)

{
  undefined8 uVar1;
  double *pdVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint face_index_count;
  ON_SimpleArray<unsigned_int> ngon_vi1;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> tmp;
  ON_3dVector B;
  ON_3dVector A;
  ON_Plane ngon_plane;
  undefined1 local_178 [16];
  double local_168;
  ON_MeshFaceList *local_158;
  ON_SimpleArray<NgonNeighbors> local_150;
  uint *local_138;
  double local_130;
  double local_128;
  ON_SimpleArray<unsigned_int> local_120;
  _func_int **local_108;
  ON_3dVector local_100;
  ON_3dPoint local_e8;
  ON_3dVector local_d0;
  ON_Plane local_b8;
  
  uVar4 = mesh_vertex_list->m_point_count;
  if ((1 < uVar4 + 1) && (ngon_fi != (uint *)0x0 && ngon_fi_count != 0)) {
    local_150._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814f70;
    local_150.m_a = (NgonNeighbors *)0x0;
    local_150.m_count = 0;
    local_150.m_capacity = 0;
    local_158 = mesh_face_list;
    if ((ngon_fi_count & 0xffffffff) == 0) {
      iVar3 = 0;
    }
    else {
      ON_SimpleArray<NgonNeighbors>::SetCapacity(&local_150,ngon_fi_count & 0xffffffff);
      iVar3 = local_150.m_capacity;
    }
    face_index_count = (uint)ngon_fi_count;
    if ((-1 < (int)face_index_count) && ((int)face_index_count <= iVar3)) {
      local_150.m_count = face_index_count;
    }
    local_138 = ngon_fi;
    uVar4 = SetFaceNeighborMap(uVar4,local_158,(uint **)0x0,vertex_face_map,face_index_count,ngon_fi
                               ,local_150.m_a);
    if (-1 < ngon_vi->m_capacity) {
      ngon_vi->m_count = 0;
    }
    uVar5 = GetNgonBoundarySegments
                      (local_158,face_index_count,local_138,1,local_150.m_a,ngon_vi,
                       (ON_SimpleArray<unsigned_int> *)0x0);
    if (uVar5 != 0) {
      local_b8.origin.x = (double)CONCAT44(local_b8.origin.x._4_4_,ngon_vi->m_count);
      ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&local_b8);
      uVar5 = ngon_vi->m_count;
      if (uVar5 < uVar4) {
        local_108 = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
        local_120._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080d8d0;
        local_120.m_a = (uint *)0x0;
        local_120.m_count = 0;
        local_120.m_capacity = 0;
        uVar4 = ngon_vi->m_a[1];
        local_e8.x = -1.23432101234321e+308;
        local_e8.y = -1.23432101234321e+308;
        local_e8.z = -1.23432101234321e+308;
        local_b8.origin.z = -1.23432101234321e+308;
        local_b8.origin.x = local_e8.x;
        local_b8.origin.y = local_e8.y;
        if (uVar4 < mesh_vertex_list->m_point_count) {
          pdVar2 = mesh_vertex_list->m_dP;
          if (pdVar2 == (double *)0x0) {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            uVar1 = *(undefined8 *)(mesh_vertex_list->m_fP + uVar6);
            local_b8.origin.x = (double)(float)uVar1;
            local_b8.origin.y = (double)(float)((ulong)uVar1 >> 0x20);
            local_b8.origin.z = (double)mesh_vertex_list->m_fP[uVar6 + 2];
          }
          else {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            local_b8.origin.x = pdVar2[uVar6];
            local_b8.origin.y = (pdVar2 + uVar6)[1];
            local_b8.origin.z = pdVar2[uVar6 + 2];
          }
        }
        uVar4 = *ngon_vi->m_a;
        if (uVar4 < mesh_vertex_list->m_point_count) {
          pdVar2 = mesh_vertex_list->m_dP;
          if (pdVar2 == (double *)0x0) {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            uVar1 = *(undefined8 *)(mesh_vertex_list->m_fP + uVar6);
            local_e8.x = (double)(float)uVar1;
            local_e8.y = (double)(float)((ulong)uVar1 >> 0x20);
            local_e8.z = (double)mesh_vertex_list->m_fP[uVar6 + 2];
          }
          else {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            local_e8.x = pdVar2[uVar6];
            local_e8.y = (pdVar2 + uVar6)[1];
            local_e8.z = pdVar2[uVar6 + 2];
          }
        }
        ON_3dPoint::operator-(&local_d0,&local_b8.origin,&local_e8);
        uVar4 = ngon_vi->m_a[(long)ngon_vi->m_count + -1];
        local_178._0_8_ = (_func_int **)0xffe5f8bd9e331dd2;
        local_178._8_8_ = (uint *)0xffe5f8bd9e331dd2;
        local_168 = -1.23432101234321e+308;
        local_b8.origin.z = -1.23432101234321e+308;
        local_b8.origin.x = (double)local_178._0_8_;
        local_b8.origin.y = (double)local_178._8_8_;
        if (uVar4 < mesh_vertex_list->m_point_count) {
          pdVar2 = mesh_vertex_list->m_dP;
          if (pdVar2 == (double *)0x0) {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            uVar1 = *(undefined8 *)(mesh_vertex_list->m_fP + uVar6);
            local_b8.origin.x = (double)(float)uVar1;
            local_b8.origin.y = (double)(float)((ulong)uVar1 >> 0x20);
            local_b8.origin.z = (double)mesh_vertex_list->m_fP[uVar6 + 2];
          }
          else {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            local_b8.origin.x = pdVar2[uVar6];
            local_b8.origin.y = (pdVar2 + uVar6)[1];
            local_b8.origin.z = pdVar2[uVar6 + 2];
          }
        }
        uVar4 = *ngon_vi->m_a;
        if (uVar4 < mesh_vertex_list->m_point_count) {
          pdVar2 = mesh_vertex_list->m_dP;
          if (pdVar2 == (double *)0x0) {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            uVar1 = *(undefined8 *)(mesh_vertex_list->m_fP + uVar6);
            local_178._0_8_ = (undefined8)(float)uVar1;
            local_178._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
            local_168 = (double)mesh_vertex_list->m_fP[uVar6 + 2];
          }
          else {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            local_178._0_8_ = pdVar2[uVar6];
            local_178._8_8_ = (pdVar2 + uVar6)[1];
            local_168 = pdVar2[uVar6 + 2];
          }
        }
        ON_3dPoint::operator-((ON_3dVector *)&local_e8,&local_b8.origin,(ON_3dPoint *)local_178);
        ON_3dVector::Unitize(&local_d0);
        ON_3dVector::Unitize((ON_3dVector *)&local_e8);
        uVar4 = *ngon_vi->m_a;
        if (uVar4 < mesh_vertex_list->m_point_count) {
          pdVar2 = mesh_vertex_list->m_dP;
          if (pdVar2 == (double *)0x0) {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            uVar1 = *(undefined8 *)(mesh_vertex_list->m_fP + uVar6);
            local_178._0_8_ = (undefined8)(float)uVar1;
            local_178._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
            local_168 = (double)mesh_vertex_list->m_fP[uVar6 + 2];
          }
          else {
            uVar6 = (ulong)(uVar4 * mesh_vertex_list->m_point_stride);
            local_178._0_8_ = pdVar2[uVar6];
            local_178._8_8_ = (pdVar2 + uVar6)[1];
            local_168 = pdVar2[uVar6 + 2];
          }
        }
        else {
          local_178._0_8_ = (_func_int **)0xffe5f8bd9e331dd2;
          local_178._8_8_ = (uint *)0xffe5f8bd9e331dd2;
          local_168 = -1.23432101234321e+308;
        }
        ON_CrossProduct(&local_100,&local_d0,(ON_3dVector *)&local_e8);
        ON_Plane::ON_Plane(&local_b8,(ON_3dPoint *)local_178,&local_100);
        local_130 = Internal_NgonBoundaryArea(&local_b8,mesh_vertex_list,ngon_vi);
        uVar4 = 2;
        while( true ) {
          local_178._0_8_ = local_108;
          local_178._8_8_ = (uint *)0x0;
          local_168 = 0.0;
          uVar5 = GetNgonBoundarySegments
                            (local_158,face_index_count,local_138,uVar4,local_150.m_a,
                             (ON_SimpleArray<unsigned_int> *)local_178,
                             (ON_SimpleArray<unsigned_int> *)0x0);
          if ((uVar5 == 0) || (local_168._0_4_ < 3)) break;
          local_128 = Internal_NgonBoundaryArea
                                (&local_b8,mesh_vertex_list,
                                 (ON_SimpleArray<unsigned_int> *)local_178);
          if (local_128 <= local_130) {
            local_100.x._0_4_ = local_168._0_4_;
            ON_SimpleArray<unsigned_int>::Append(ngon_vi_markers,(uint *)&local_100);
            ON_SimpleArray<unsigned_int>::Append(ngon_vi,local_168._0_4_,(uint *)local_178._8_8_);
          }
          else {
            if (local_120.m_a != (uint *)0x0) {
              memset(local_120.m_a,0,(long)local_120.m_capacity << 2);
            }
            local_120._16_8_ = local_120._16_8_ & 0xffffffff00000000;
            ON_SimpleArray<unsigned_int>::Append(&local_120,local_168._0_4_,(uint *)local_178._8_8_)
            ;
            ON_SimpleArray<unsigned_int>::Append(&local_120,ngon_vi->m_count,ngon_vi->m_a);
            ON_SimpleArray<unsigned_int>::operator=(ngon_vi,&local_120);
            local_100.x._0_4_ = local_168._0_4_;
            ON_SimpleArray<unsigned_int>::Insert(ngon_vi_markers,0,(uint *)&local_100);
            local_130 = local_128;
          }
          ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_178);
          uVar4 = uVar4 + 1;
        }
        ON_SimpleArray<unsigned_int>::~ON_SimpleArray((ON_SimpleArray<unsigned_int> *)local_178);
        ON_Plane::~ON_Plane(&local_b8);
        ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_120);
        uVar5 = ngon_vi->m_count;
      }
      ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_150);
      return uVar5;
    }
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_150);
  }
  if (-1 < ngon_vi->m_capacity) {
    ngon_vi->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::FindNgonBoundaries(
  const class ON_3dPointListRef& mesh_vertex_list,
  const class ON_MeshFaceList& mesh_face_list,
  ON_MeshVertexFaceMap* vertex_face_map,
  size_t ngon_fi_count,
  const unsigned int* ngon_fi,
  ON_SimpleArray<unsigned int>& ngon_vi,
  ON_SimpleArray<unsigned int>& ngon_vi_markers
)
{
  return FindNgonBoundaries_Helper(
    mesh_vertex_list,
    mesh_face_list,
    nullptr,
    vertex_face_map,
    ngon_fi_count,
    ngon_fi,
    ngon_vi,
    ngon_vi_markers,
    false
  );
}